

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

void __thiscall
t_c_glib_generator::generate_serialize_field
          (t_c_glib_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix,
          int error_ret)

{
  int iVar1;
  t_type *ttype;
  long *plVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  logic_error *this_00;
  size_type *psVar5;
  t_struct *tstruct;
  long lVar6;
  char *pcVar7;
  t_base_type *this_01;
  undefined1 auVar8 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  std::operator+(&local_d0,prefix,&tfield->name_);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(suffix->_M_dataplus)._M_p);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_110.field_2._M_allocated_capacity = *psVar5;
    local_110.field_2._8_8_ = plVar2[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar5;
    local_110._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_110._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar1 != '\0') {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar4,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",&local_110);
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar1 == '\0')) {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar1 == '\0')) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_70,"DO NOT KNOW HOW TO SERIALIZE FIELD \'",&local_110);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_f0._M_dataplus._M_p = (pointer)*plVar2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((size_type *)local_f0._M_dataplus._M_p == psVar5) {
          local_f0.field_2._M_allocated_capacity = *psVar5;
          local_f0.field_2._8_8_ = plVar2[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar5;
        }
        local_f0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        type_name_abi_cxx11_(&local_50,this,ttype,false,false);
        std::operator+(&local_d0,&local_f0,&local_50);
        std::logic_error::logic_error(this_00,(string *)&local_d0);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"if ((ret = thrift_protocol_write_",0x21);
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"i32 (protocol, (gint32) ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,local_110._M_dataplus._M_p,local_110._M_string_length);
      }
      else {
        this_01 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        lVar6 = 0x10;
        switch(this_01) {
        case (t_base_type *)0x0:
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                         &local_110);
          __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
          if ((char)iVar1 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(out,"binary (protocol, ",0x12);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,local_110._M_dataplus._M_p,local_110._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ? ((GByteArray *) ",0x13);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,local_110._M_dataplus._M_p,local_110._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,")->data : NULL, ",0x10);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,local_110._M_dataplus._M_p,local_110._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ? ((GByteArray *) ",0x13);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,local_110._M_dataplus._M_p,local_110._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,")->len : 0",10);
            goto LAB_0016a26c;
          }
          lVar6 = 0x12;
          pcVar7 = "string (protocol, ";
          break;
        case (t_base_type *)0x2:
          pcVar7 = "bool (protocol, ";
          break;
        case (t_base_type *)0x3:
          pcVar7 = "byte (protocol, ";
          break;
        case (t_base_type *)0x4:
          lVar6 = 0xf;
          pcVar7 = "i16 (protocol, ";
          break;
        case (t_base_type *)0x5:
          lVar6 = 0xf;
          pcVar7 = "i32 (protocol, ";
          break;
        case (t_base_type *)0x6:
          lVar6 = 0xf;
          pcVar7 = "i64 (protocol, ";
          break;
        case (t_base_type *)0x7:
          lVar6 = 0x12;
          pcVar7 = "double (protocol, ";
          break;
        default:
          auVar8 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_f0,this_01,auVar8._8_4_);
          std::operator+(&local_d0,"compiler error: no C writer for base type ",&local_f0);
          std::operator+(auVar8._0_8_,&local_d0,&local_110);
          __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,lVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,local_110._M_dataplus._M_p,local_110._M_string_length);
      }
LAB_0016a26c:
      std::__ostream_insert<char,std::char_traits<char>>(out,", error)) < 0)",0xe);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
      ;
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  return ",9);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,error_ret);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"xfer += ret;",0xc);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0016a00f;
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      generate_serialize_container(this,out,ttype,&local_b0,error_ret);
      local_d0._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_0016a00f;
    }
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_110._M_dataplus._M_p,
               local_110._M_dataplus._M_p + local_110._M_string_length);
    generate_serialize_struct(this,out,tstruct,&local_90,error_ret);
    local_d0._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0016a00f;
  }
  operator_delete(local_d0._M_dataplus._M_p);
LAB_0016a00f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_field(ostream& out,
                                                  t_field* tfield,
                                                  string prefix,
                                                  string suffix,
                                                  int error_ret) {
  t_type* type = get_true_type(tfield->get_type());
  string name = prefix + tfield->get_name() + suffix;

  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name, error_ret);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name, error_ret);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << "if ((ret = thrift_protocol_write_";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_BOOL:
        out << "bool (protocol, " << name;
        break;
      case t_base_type::TYPE_I8:
        out << "byte (protocol, " << name;
        break;
      case t_base_type::TYPE_I16:
        out << "i16 (protocol, " << name;
        break;
      case t_base_type::TYPE_I32:
        out << "i32 (protocol, " << name;
        break;
      case t_base_type::TYPE_I64:
        out << "i64 (protocol, " << name;
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "double (protocol, " << name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "binary (protocol, " << name << " ? ((GByteArray *) " << name << ")->data : NULL, "
              << name << " ? ((GByteArray *) " << name << ")->len : 0";
        } else {
          out << "string (protocol, " << name;
        }
        break;
      default:
        throw "compiler error: no C writer for base type " + t_base_type::t_base_name(tbase) + name;
      }
    } else {
      out << "i32 (protocol, (gint32) " << name;
    }
    out << ", error)) < 0)" << endl
        << indent() << "  return " << error_ret << ";" << endl
        << indent() << "xfer += ret;" << endl << endl;
  } else {
    throw std::logic_error("DO NOT KNOW HOW TO SERIALIZE FIELD '" + name + "' TYPE '"
                           + type_name(type));
  }
}